

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall SymmetricAlgorithm::isBlockCipher(SymmetricAlgorithm *this)

{
  return this->currentCipherMode == ECB || this->currentCipherMode == CBC;
}

Assistant:

bool SymmetricAlgorithm::isBlockCipher()
{
	switch (currentCipherMode)
	{
		case SymMode::CBC:
		case SymMode::ECB:
			return true;
		default:
			break;
	}

	return false;
}